

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O0

void __thiscall polyscope::Group::addChildGroup(Group *this,Group *newChild)

{
  Group *pGVar1;
  Group *in_RSI;
  value_type *in_stack_fffffffffffffe68;
  Group *in_stack_fffffffffffffe70;
  WeakHandle<polyscope::Group> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  Group *in_stack_fffffffffffffed0;
  Group *in_stack_fffffffffffffed8;
  string local_110 [16];
  Group *in_stack_ffffffffffffff00;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  Group *local_10;
  
  local_10 = in_RSI;
  cullExpiredChildren(in_stack_ffffffffffffff00);
  unparent(in_stack_fffffffffffffe70);
  pGVar1 = getTopLevelGrandparent(in_stack_fffffffffffffe70);
  if (pGVar1 == local_10) {
    std::operator+(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe70);
    std::operator+(in_stack_fffffffffffffe78,(char *)in_stack_fffffffffffffe70);
    exception((string *)in_stack_fffffffffffffed0);
    std::__cxx11::string::~string(local_30);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_110);
  }
  else {
    this_00 = (WeakHandle<polyscope::Group> *)&stack0xfffffffffffffec0;
    WeakReferrable::getWeakHandle<polyscope::Group>
              ((WeakReferrable *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    WeakHandle<polyscope::Group>::operator=(this_00,in_stack_fffffffffffffe68);
    WeakHandle<polyscope::Group>::~WeakHandle((WeakHandle<polyscope::Group> *)0x3d48fa);
    WeakReferrable::getWeakHandle<polyscope::Group>
              ((WeakReferrable *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    std::
    vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
    ::push_back((vector<polyscope::WeakHandle<polyscope::Group>,_std::allocator<polyscope::WeakHandle<polyscope::Group>_>_>
                 *)this_00,in_stack_fffffffffffffe68);
    WeakHandle<polyscope::Group>::~WeakHandle((WeakHandle<polyscope::Group> *)0x3d4949);
  }
  return;
}

Assistant:

void Group::addChildGroup(Group& newChild) {
  cullExpiredChildren();

  // if child is already in a group, remove it from that group
  newChild.unparent();

  if (getTopLevelGrandparent() == &newChild) {
    exception("Attempted to make group " + newChild.name + " a child of " + name +
              ", but this would create a cycle (group " + name + " is already a descendant of " + newChild.name + ")");
    return;
  }

  // assign to the new group
  newChild.parentGroup = this->getWeakHandle<Group>(); // we want a weak pointer to the shared ptr
  childrenGroups.push_back(newChild.getWeakHandle<Group>());
}